

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

void M_SetEntry(Matrix *M,size_t RoC,size_t Entry,size_t Pos,Real Val)

{
  LASErrIdType LVar1;
  Real Val_local;
  size_t Pos_local;
  size_t Entry_local;
  size_t RoC_local;
  Matrix *M_local;
  
  LVar1 = LASResult();
  if (LVar1 == LASOK) {
    if (((((M->ElOrder == Rowws) && (RoC != 0)) && (RoC <= M->RowDim)) &&
        ((Pos != 0 && (Pos <= M->ClmDim)))) ||
       ((((M->ElOrder == Clmws && ((RoC != 0 && (RoC <= M->ClmDim)))) && (Pos != 0)) &&
        ((Pos <= M->RowDim && (Entry < M->Len[RoC])))))) {
      M->El[RoC][Entry].Val = Val;
      M->El[RoC][Entry].Pos = Pos;
    }
    else {
      LASError(LASRangeErr,"M_SetEntry",M->Name,(char *)0x0,(char *)0x0);
    }
  }
  return;
}

Assistant:

void M_SetEntry(Matrix *M, size_t RoC, size_t Entry, size_t Pos, Real Val)
/* set a new matrix entry */
{
    if (LASResult() == LASOK) {
        if ((M->ElOrder == Rowws && RoC > 0 && RoC <= M->RowDim && Pos > 0 && Pos <= M->ClmDim) ||
            ((M->ElOrder == Clmws && RoC > 0 && RoC <= M->ClmDim && Pos > 0 && Pos <= M->RowDim) &&
            (Entry < M->Len[RoC]))) {
            M->El[RoC][Entry].Val = Val;
            M->El[RoC][Entry].Pos = Pos;
        } else {
            LASError(LASRangeErr, "M_SetEntry", M->Name, NULL, NULL);
        }
    }
}